

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves.cpp
# Opt level: O3

int __thiscall linkedMoveList::remove(linkedMoveList *this,char *__filename)

{
  int extraout_EAX;
  uint uVar1;
  ulong uVar2;
  moveNode *pmVar3;
  moveNode *pmVar4;
  
  pmVar4 = this->head;
  if ((int)__filename == 0) {
    this->head = pmVar4->next;
  }
  else {
    uVar2 = 1;
    if (1 < (int)__filename) {
      uVar2 = (ulong)__filename & 0xffffffff;
    }
    do {
      pmVar3 = pmVar4;
      pmVar4 = pmVar3->next;
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
    pmVar3->next = pmVar4->next;
    if (pmVar4 == this->tail) {
      this->tail = pmVar3;
    }
  }
  operator_delete(pmVar4,0x10);
  return extraout_EAX;
}

Assistant:

void linkedMoveList::remove(int pos){
	if(pos == 0) {
		moveNode *temp = head;
		head = head->next;
		delete temp;
	} else {
		moveNode *current = head->next;
		moveNode *previous = head;
		for(int i = 1; i < pos; i++){
			previous = current;
			current = current->next;
		}
		previous->next = current->next;
		if(current == tail) tail = previous;
		delete current;
	}
}